

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O2

Allocation * __thiscall
density::detail::
LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
::external_allocate<(density::detail::LfQueue_ProgressGuarantee)0>
          (Allocation *__return_storage_ptr__,
          LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          *this,uintptr_t i_control_bits,size_t i_size,size_t i_alignment)

{
  void *i_block;
  Allocation inplace_put;
  
  i_block = aligned_allocate(i_size,i_alignment,0);
  SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0>
            (&inplace_put,
             (SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
              *)this,i_control_bits | 4,true,0x18,8);
  if (inplace_put.m_user_storage == (void *)0x0) {
    aligned_deallocate(i_block,i_size,i_alignment,0);
    i_block = (void *)0x0;
  }
  else {
    *(void **)inplace_put.m_user_storage = i_block;
    *(size_t *)((long)inplace_put.m_user_storage + 8) = i_size;
    *(size_t *)((long)inplace_put.m_user_storage + 0x10) = i_alignment;
    __return_storage_ptr__->m_control_block = inplace_put.m_control_block;
    __return_storage_ptr__->m_next_ptr = inplace_put.m_next_ptr;
  }
  __return_storage_ptr__->m_user_storage = i_block;
  return __return_storage_ptr__;
}

Assistant:

DENSITY_NO_INLINE Allocation external_allocate(
              uintptr_t i_control_bits,
              size_t    i_size,
              size_t    i_alignment) noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee = PROGRESS_GUARANTEE; // used to avoid warnings about
                                                     // constant conditional expressions
                DENSITY_ASSUME(guarantee == LfQueue_Throwing || guarantee == LfQueue_Blocking);

                void * external_block;
                if (guarantee == LfQueue_Throwing)
                {
                    external_block = ALLOCATOR_TYPE::allocate(i_size, i_alignment);
                }
                else
                {
                    external_block = ALLOCATOR_TYPE::try_allocate(i_size, i_alignment);
                    if (external_block == nullptr)
                    {
                        return Allocation{};
                    }
                }

                try
                {
                    /* external blocks always allocate space for the type, because it would be
                        complicated for the consumers to handle both cases */
                    auto const inplace_put =
                      static_cast<DERIVED *>(this)
                        ->template try_inplace_allocate_impl<PROGRESS_GUARANTEE>(
                          i_control_bits | LfQueue_External,
                          true,
                          sizeof(ExternalBlock),
                          alignof(ExternalBlock));
                    if (inplace_put.m_user_storage == nullptr)
                    {
                        ALLOCATOR_TYPE::deallocate(external_block, i_size, i_alignment);
                        return Allocation{};
                    }
                    new (inplace_put.m_user_storage)
                      ExternalBlock{external_block, i_size, i_alignment};
                    return Allocation{
                      inplace_put.m_control_block, inplace_put.m_next_ptr, external_block};
                }
                catch (...)
                {
                    /* if inplace_allocate fails, that means that we were able to allocate the
                        external block, but we were not able to put the struct ExternalBlock in
                        the page (because a new page was necessary, but we could not allocate
                        it). */
                    ALLOCATOR_TYPE::deallocate(external_block, i_size, i_alignment);
                    DENSITY_INTERNAL_RETHROW_FROM_NOEXCEPT;
                }
            }